

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformEdgeSampleCollection.h
# Opt level: O0

OrderedEdgeCollection *
GetEdgesByUniSampling(OrderedEdgeCollection *__return_storage_ptr__,CGraph *cg,long params)

{
  size_type __n;
  size_type sVar1;
  long lVar2;
  long *plVar3;
  size_type __n_00;
  EdgeIdx EVar4;
  EdgeIdx EVar5;
  reference rVar6;
  reference local_170;
  reference local_160;
  reference local_150;
  value_type local_140;
  EdgeIdx local_120;
  VertexIdx low_deg;
  VertexIdx v;
  VertexIdx u;
  EdgeIdx e;
  EdgeIdx i;
  uniform_int_distribution<long> unif_rand_edge;
  EdgeIdx nEdges;
  VertexIdx dst;
  VertexIdx src;
  VertexIdx no_of_query;
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  allocator<bool> local_82;
  bool local_81;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  EdgeIdx walk_length;
  VertexIdx seed_count;
  EdgeIdx m;
  VertexIdx n;
  Parameters *params_local;
  CGraph *cg_local;
  OrderedEdgeCollection *returnEdgeCollection;
  
  __n = cg->nVertices;
  sVar1 = cg->nEdges;
  lVar2 = *(long *)(params + 0x40);
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  local_81 = false;
  std::allocator<bool>::allocator(&local_82);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,sVar1,&local_81,&local_82);
  std::allocator<bool>::~allocator(&local_82);
  no_of_query._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&no_of_query + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c0,__n,(bool *)((long)&no_of_query + 7),
             (allocator<bool> *)((long)&no_of_query + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&no_of_query + 6));
  src = 0;
  unif_rand_edge._M_param._M_b = 0;
  std::uniform_int_distribution<long>::uniform_int_distribution
            ((uniform_int_distribution<long> *)&i,0,sVar1 - 1);
  e = 0;
  do {
    if (lVar2 <= e) {
      __return_storage_ptr__->no_of_edges = lVar2;
      std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
                (&__return_storage_ptr__->edge_list,
                 (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
                 &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&__return_storage_ptr__->visited_edge_set,
                 (vector<bool,_std::allocator<bool>_> *)local_80);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&__return_storage_ptr__->visited_vertex_set,
                 (vector<bool,_std::allocator<bool>_> *)local_c0);
      __return_storage_ptr__->no_of_query = src;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_80);
      std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::~vector
                ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
                 &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    u = std::uniform_int_distribution<long>::operator()
                  ((uniform_int_distribution<long> *)&i,
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)&stack0x00000008);
    sVar1 = cg->nbors[u];
    src = src + 1;
    plVar3 = std::upper_bound<long*,long>(cg->offsets,cg->offsets + __n,&u);
    __n_00 = ((long)plVar3 - (long)cg->offsets >> 3) - 1;
    EVar4 = Escape::CGraph::getEdgeBinary(cg,__n_00,sVar1);
    if (EVar4 != u) {
      printf("Bug in the code!! Run!!!! \n\n");
    }
    EVar4 = Escape::CGraph::degree(cg,sVar1);
    EVar5 = Escape::CGraph::degree(cg,__n_00);
    if (EVar4 < EVar5) {
LAB_0010e275:
      low_deg = __n_00;
      v = sVar1;
      local_120 = Escape::CGraph::degree(cg,sVar1);
    }
    else {
      EVar4 = Escape::CGraph::degree(cg,sVar1);
      EVar5 = Escape::CGraph::degree(cg,__n_00);
      if ((EVar4 == EVar5) && ((long)sVar1 < (long)__n_00)) goto LAB_0010e275;
      low_deg = sVar1;
      v = __n_00;
      local_120 = Escape::CGraph::degree(cg,__n_00);
    }
    local_140.u = v;
    local_140.v = low_deg;
    local_140.index = u;
    local_140.degree = local_120;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
               &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,&local_140);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_80,u);
    local_150 = rVar6;
    std::_Bit_reference::operator=(&local_150,true);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_c0,__n_00);
    local_160 = rVar6;
    std::_Bit_reference::operator=(&local_160,true);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_c0,sVar1);
    local_170 = rVar6;
    std::_Bit_reference::operator=(&local_170,true);
    e = e + 1;
  } while( true );
}

Assistant:

OrderedEdgeCollection GetEdgesByUniSampling(CGraph *cg, const Parameters &params, std::mt19937 mt) {
    /**
      * Setting of various input parameters for executing the algorithm
    */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count;
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and local variables
    */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool> visited_edge_set (m,false);
    std::vector<bool> visited_vertex_set (n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx src = 0, dst = 0;
    EdgeIdx nEdges = 0;
    /**
       * Set up random number generator
    */
    std::uniform_int_distribution<EdgeIdx> unif_rand_edge(0, m - 1);

    /**
     * Sample uniform random edges and store them in the structure
     */
    for (EdgeIdx i = 0; i < walk_length ; i++) {
        EdgeIdx e = unif_rand_edge(mt);
        dst = cg->nbors[e];
        no_of_query++; // One query to the uniform random neighbor oracle
        // binary search the array cg->offset to find the index v, such that edges[e] lies between cg->offset[v]
        // and cg->offset[v+1]. We achieve this by calling std::upper_bound
        src = std::upper_bound (cg->offsets, cg->offsets+n, e) - cg->offsets -1;

        // sanity check: the edge {src,dst} must have index edges[e].
        if (cg->getEdgeBinary(src,dst) != e)
            printf("Bug in the code!! Run!!!! \n\n");

        /**
          * Update the edge collection data structure with relevant information about the edge
         */
        VertexIdx u, v, low_deg;
        if (cg->degree(dst) < cg->degree(src) || (cg->degree(dst) == cg->degree(src) && dst < src)) {
            u = dst;
            v = src;
            low_deg = cg->degree(dst);
        } else {
            u = src;
            v = dst;
            low_deg = cg->degree(src);
        }
        edge_list.push_back(OrderedEdge{u, v, e, low_deg});

        /**
         * Update the book-keeping data structure with the visited edge and vertices
         */
        visited_edge_set[e] = true;
        visited_vertex_set[src] = true;
        visited_vertex_set[dst] = true;
    }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set, no_of_query};
    return returnEdgeCollection;
}